

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

void tinyformat::format<int,int,int,char[12],char[9]>
               (ostream *out,char *fmt,int *args,int *args_1,int *args_2,char (*args_3) [12],
               char (*args_4) [9])

{
  FormatArg local_78;
  int *local_60;
  code *local_58;
  code *local_50;
  int *local_48;
  code *local_40;
  code *local_38;
  char (*local_30) [12];
  code *local_28;
  code *local_20;
  char (*local_18) [9];
  code *local_10;
  code *local_8;
  
  local_78.m_formatImpl = detail::FormatArg::formatImpl<int>;
  local_78.m_toIntImpl = detail::FormatArg::toIntImpl<int>;
  local_58 = detail::FormatArg::formatImpl<int>;
  local_50 = detail::FormatArg::toIntImpl<int>;
  local_40 = detail::FormatArg::formatImpl<int>;
  local_38 = detail::FormatArg::toIntImpl<int>;
  local_28 = detail::FormatArg::formatImpl<char[12]>;
  local_20 = detail::FormatArg::toIntImpl<char[12]>;
  local_18 = args_4;
  local_10 = detail::FormatArg::formatImpl<char[9]>;
  local_8 = detail::FormatArg::toIntImpl<char[9]>;
  local_78.m_value = args;
  local_60 = args_1;
  local_48 = args_2;
  local_30 = args_3;
  detail::formatImpl(out,fmt,&local_78,5);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}